

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<short,short,short,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseANDOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool bVar1;
  short sVar2;
  short *psVar3;
  short *psVar4;
  short *psVar5;
  undefined1 in_CL;
  Vector *in_RDX;
  short *result_data;
  short *rdata;
  short *ldata;
  ValidityMask *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc2;
  ushort right_00;
  undefined1 fun_00;
  
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  psVar3 = ConstantVector::GetData<short>((Vector *)0xe3d7f4);
  psVar4 = ConstantVector::GetData<short>((Vector *)0xe3d803);
  psVar5 = ConstantVector::GetData<short>((Vector *)0xe3d812);
  bVar1 = ConstantVector::IsNull((Vector *)0xe3d821);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0xe3d82f), !bVar1)) {
    right_00 = CONCAT11(in_CL,in_stack_ffffffffffffffc2) & 0x1ff;
    sVar2 = *psVar3;
    fun_00 = (undefined1)((ushort)*psVar4 >> 8);
    ConstantVector::Validity(in_RDX);
    sVar2 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::BitwiseANDOperator,short,short,short>
                      ((bool)fun_00,sVar2,right_00,in_stack_ffffffffffffffb8,0xe3d89c);
    *psVar5 = sVar2;
    return;
  }
  duckdb::ConstantVector::SetNull(in_RDX,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}